

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

sim_result * analyzeConflict(Abc_Ntk_t *pNtk,int *pModel,int fVerbose)

{
  uint uVar1;
  void **ppvVar2;
  Vec_Ptr_t *pVVar3;
  sim_result *psVar4;
  int *piVar5;
  int *piVar6;
  int *__ptr;
  Vec_Ptr_t *pVVar7;
  char *pcVar8;
  long lVar9;
  int iVar10;
  
  iVar10 = pNtk->vPos->nSize;
  uVar1 = pNtk->vPis->nSize;
  psVar4 = (sim_result *)malloc(0x20);
  piVar5 = (int *)malloc((long)(int)uVar1 * 4);
  psVar4->inVec = piVar5;
  piVar6 = (int *)malloc((long)iVar10 << 2);
  psVar4->outVec = piVar6;
  __ptr = Abc_NtkVerifySimulatePattern(pNtk,pModel);
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    ppvVar2 = pVVar7->pArray;
    lVar9 = 0;
    do {
      piVar5[*(int *)((long)ppvVar2[lVar9] + 0x10) - 1] = pModel[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar7->nSize);
  }
  pVVar3 = pNtk->vCos;
  if (pVVar3->nSize < 1) {
    iVar10 = 0;
  }
  else {
    ppvVar2 = pVVar3->pArray;
    lVar9 = 0;
    iVar10 = 0;
    do {
      iVar10 = (iVar10 + 1) - (uint)(__ptr[lVar9] == 0);
      piVar6[*(int *)((long)ppvVar2[lVar9] + 0x10) + ~uVar1] = __ptr[lVar9];
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar3->nSize);
  }
  psVar4->outVecOnes = iVar10;
  psVar4->activity = 0.0;
  if (fVerbose != 0) {
    if (0 < pVVar7->nSize) {
      lVar9 = 0;
      do {
        pcVar8 = Abc_ObjName((Abc_Obj_t *)pVVar7->pArray[lVar9]);
        printf(" %s=%d",pcVar8,(ulong)(uint)pModel[lVar9]);
        lVar9 = lVar9 + 1;
        pVVar7 = pNtk->vCis;
      } while (lVar9 < pVVar7->nSize);
    }
    putchar(10);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  return psVar4;
}

Assistant:

static struct sim_result *
analyzeConflict( Abc_Ntk_t * pNtk, int * pModel, int fVerbose )
{   
    Abc_Obj_t * pNode;
    int i, count = 0;
    int * pValues;
    struct sim_result * cex;
    int numouts = Abc_NtkPoNum(pNtk);
    int numins = Abc_NtkPiNum(pNtk);
    
    cex = ABC_ALLOC(struct sim_result, 1);  
    cex->inVec = ints( numins );
    cex->outVec =  ints( numouts ); 

    /* get the CO values under this model */
    pValues = Abc_NtkVerifySimulatePattern( pNtk, pModel );    

    Abc_NtkForEachCi( pNtk, pNode, i ) 
        cex->inVec[Abc_ObjId(pNode)-1] = pModel[i];
    Abc_NtkForEachCo( pNtk, pNode, i ) {
        cex->outVec[Abc_ObjId(pNode)-numins-1] = pValues[i];
        if (pValues[i]) count++;
    }   
    
    cex->outVecOnes = count;
    cex->activity = 0;  

    if (fVerbose) {
        Abc_NtkForEachCi( pNtk, pNode, i )
            printf(" %s=%d", Abc_ObjName(pNode), pModel[i]);
        printf("\n");
    }

    ABC_FREE( pValues );    

    return cex;
}